

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

string * __thiscall
om::net::mac_addr::to_string_abi_cxx11_(string *__return_storage_ptr__,mac_addr *this)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  mac_addr *local_18;
  mac_addr *this_local;
  
  local_18 = this;
  this_local = (mac_addr *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = (ostream *)std::ostream::operator<<(local_190,Catch::clara::std::hex);
  _Var2 = Catch::clara::std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  _Var1 = Catch::clara::std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_addr[0]);
  poVar3 = std::operator<<(poVar3,':');
  _Var2 = Catch::clara::std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  _Var1 = Catch::clara::std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_addr[1]);
  poVar3 = std::operator<<(poVar3,':');
  _Var2 = Catch::clara::std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  _Var1 = Catch::clara::std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_addr[2]);
  poVar3 = std::operator<<(poVar3,':');
  _Var2 = Catch::clara::std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  _Var1 = Catch::clara::std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_addr[3]);
  poVar3 = std::operator<<(poVar3,':');
  _Var2 = Catch::clara::std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  _Var1 = Catch::clara::std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_addr[4]);
  poVar3 = std::operator<<(poVar3,':');
  _Var2 = Catch::clara::std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  _Var1 = Catch::clara::std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  std::ostream::operator<<(poVar3,(uint)this->_addr[5]);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
			{
				std::stringstream ss;
				ss << std::hex
				   << std::setw(2) << std::setfill('0') << (int) _addr[0] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[1] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[2] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[3] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[4] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[5];
				return ss.str();
			}